

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.c
# Opt level: O0

int uv_loop_init(uv_loop_t *loop)

{
  void *pvVar1;
  uv_loop_t *puVar2;
  int local_24;
  int err;
  void *saved_data;
  uv_loop_t *loop_local;
  
  pvVar1 = loop->data;
  memset(loop,0,0x350);
  loop->data = pvVar1;
  heap_init((heap *)&loop->timer_heap);
  loop->wq[0] = loop->wq;
  loop->wq[1] = loop->wq;
  loop->idle_handles[0] = loop->idle_handles;
  loop->idle_handles[1] = loop->idle_handles;
  loop->async_handles[0] = loop->async_handles;
  loop->async_handles[1] = loop->async_handles;
  loop->check_handles[0] = loop->check_handles;
  loop->check_handles[1] = loop->check_handles;
  loop->prepare_handles[0] = loop->prepare_handles;
  loop->prepare_handles[1] = loop->prepare_handles;
  loop->handle_queue[0] = loop->handle_queue;
  loop->handle_queue[1] = loop->handle_queue;
  loop->active_handles = 0;
  (loop->active_reqs).count = 0;
  loop->nfds = 0;
  loop->watchers = (uv__io_t **)0x0;
  loop->nwatchers = 0;
  loop->pending_queue[0] = loop->pending_queue;
  loop->pending_queue[1] = loop->pending_queue;
  loop->watcher_queue[0] = loop->watcher_queue;
  loop->watcher_queue[1] = loop->watcher_queue;
  loop->closing_handles = (uv_handle_t *)0x0;
  uv__update_time(loop);
  (loop->async_io_watcher).fd = -1;
  loop->async_wfd = -1;
  loop->signal_pipefd[0] = -1;
  loop->signal_pipefd[1] = -1;
  loop->backend_fd = -1;
  loop->emfile_fd = -1;
  loop->timer_counter = 0;
  loop->stop_flag = 0;
  loop_local._4_4_ = uv__platform_loop_init(loop);
  if (loop_local._4_4_ == 0) {
    uv__signal_global_once_init();
    local_24 = uv_signal_init(loop,&loop->child_watcher);
    if (local_24 == 0) {
      if (((((loop->child_watcher).flags & 8) != 0) &&
          ((loop->child_watcher).flags = (loop->child_watcher).flags & 0xfffffff7,
          ((loop->child_watcher).flags & 1) == 0)) && (((loop->child_watcher).flags & 4) != 0)) {
        puVar2 = (loop->child_watcher).loop;
        puVar2->active_handles = puVar2->active_handles - 1;
      }
      (loop->child_watcher).flags = (loop->child_watcher).flags | 0x10;
      loop->process_handles[0] = loop->process_handles;
      loop->process_handles[1] = loop->process_handles;
      local_24 = uv_rwlock_init(&loop->cloexec_lock);
      if (local_24 == 0) {
        local_24 = uv_mutex_init(&loop->wq_mutex);
        if (local_24 == 0) {
          local_24 = uv_async_init(loop,&loop->wq_async,uv__work_done);
          if (local_24 == 0) {
            if (((((loop->wq_async).flags & 8) != 0) &&
                ((loop->wq_async).flags = (loop->wq_async).flags & 0xfffffff7,
                ((loop->wq_async).flags & 1) == 0)) && (((loop->wq_async).flags & 4) != 0)) {
              puVar2 = (loop->wq_async).loop;
              puVar2->active_handles = puVar2->active_handles - 1;
            }
            (loop->wq_async).flags = (loop->wq_async).flags | 0x10;
            return 0;
          }
          uv_mutex_destroy(&loop->wq_mutex);
        }
        uv_rwlock_destroy(&loop->cloexec_lock);
      }
      uv__signal_loop_cleanup(loop);
    }
    uv__platform_loop_delete(loop);
    loop_local._4_4_ = local_24;
  }
  return loop_local._4_4_;
}

Assistant:

int uv_loop_init(uv_loop_t* loop) {
  void* saved_data;
  int err;


  saved_data = loop->data;
  memset(loop, 0, sizeof(*loop));
  loop->data = saved_data;

  heap_init((struct heap*) &loop->timer_heap);
  QUEUE_INIT(&loop->wq);
  QUEUE_INIT(&loop->idle_handles);
  QUEUE_INIT(&loop->async_handles);
  QUEUE_INIT(&loop->check_handles);
  QUEUE_INIT(&loop->prepare_handles);
  QUEUE_INIT(&loop->handle_queue);

  loop->active_handles = 0;
  loop->active_reqs.count = 0;
  loop->nfds = 0;
  loop->watchers = NULL;
  loop->nwatchers = 0;
  QUEUE_INIT(&loop->pending_queue);
  QUEUE_INIT(&loop->watcher_queue);

  loop->closing_handles = NULL;
  uv__update_time(loop);
  loop->async_io_watcher.fd = -1;
  loop->async_wfd = -1;
  loop->signal_pipefd[0] = -1;
  loop->signal_pipefd[1] = -1;
  loop->backend_fd = -1;
  loop->emfile_fd = -1;

  loop->timer_counter = 0;
  loop->stop_flag = 0;

  err = uv__platform_loop_init(loop);
  if (err)
    return err;

  uv__signal_global_once_init();
  err = uv_signal_init(loop, &loop->child_watcher);
  if (err)
    goto fail_signal_init;

  uv__handle_unref(&loop->child_watcher);
  loop->child_watcher.flags |= UV_HANDLE_INTERNAL;
  QUEUE_INIT(&loop->process_handles);

  err = uv_rwlock_init(&loop->cloexec_lock);
  if (err)
    goto fail_rwlock_init;

  err = uv_mutex_init(&loop->wq_mutex);
  if (err)
    goto fail_mutex_init;

  err = uv_async_init(loop, &loop->wq_async, uv__work_done);
  if (err)
    goto fail_async_init;

  uv__handle_unref(&loop->wq_async);
  loop->wq_async.flags |= UV_HANDLE_INTERNAL;

  return 0;

fail_async_init:
  uv_mutex_destroy(&loop->wq_mutex);

fail_mutex_init:
  uv_rwlock_destroy(&loop->cloexec_lock);

fail_rwlock_init:
  uv__signal_loop_cleanup(loop);

fail_signal_init:
  uv__platform_loop_delete(loop);

  return err;
}